

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall
benchmark::internal::BenchmarkImp::DenseRange(BenchmarkImp *this,int start,int limit,int step)

{
  pointer pvVar1;
  ulong uVar2;
  char *check;
  int line;
  initializer_list<int> __l;
  allocator_type local_4d;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  pvVar1 = (this->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pvVar1 == (this->args_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) ||
      (uVar2 = (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start & 0x3fffffffc, uVar2 == 0x3fffffffc)) ||
     (uVar2 == 4)) {
    GetNullLogInstance();
    if (start < 0) {
      check = "(start) >= (0)";
      line = 0x218;
    }
    else {
      GetNullLogInstance();
      if (start <= limit) {
        GetNullLogInstance();
        do {
          __l._M_len = 1;
          __l._M_array = &local_4c;
          local_4c = start;
          std::vector<int,_std::allocator<int>_>::vector(&local_48,__l,&local_4d);
          std::
          vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
          ::emplace_back<std::vector<int,std::allocator<int>>>
                    ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                      *)&this->args_,&local_48);
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          start = start + step;
        } while (start <= limit);
        return;
      }
      check = "(start) <= (limit)";
      line = 0x219;
    }
  }
  else {
    check = "ArgsCnt() == -1 || ArgsCnt() == 1";
    line = 0x217;
  }
  CheckHandler::CheckHandler
            ((CheckHandler *)&local_48,check,
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
             ,"DenseRange",line);
  CheckHandler::~CheckHandler((CheckHandler *)&local_48);
}

Assistant:

void BenchmarkImp::DenseRange(int start, int limit, int step) {
  CHECK(ArgsCnt() == -1 || ArgsCnt() == 1);
  CHECK_GE(start, 0);
  CHECK_LE(start, limit);
  for (int arg = start; arg <= limit; arg+= step) {
    args_.push_back({arg});
  }
}